

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void printInterval<dg::ADT::DiscreteInterval<dg::Offset>const>
               (DiscreteInterval<dg::Offset> *I,char *pref,char *suff)

{
  bool bVar1;
  type tVar2;
  long in_RDX;
  long in_RSI;
  Offset *in_RDI;
  
  if (in_RSI != 0) {
    printf("%s",in_RSI);
  }
  bVar1 = dg::Offset::isUnknown(in_RDI);
  if (bVar1) {
    printf("[? - ");
  }
  else {
    tVar2 = dg::Offset::operator*(in_RDI);
    printf("[%lu - ",tVar2);
  }
  bVar1 = dg::Offset::isUnknown(in_RDI + 1);
  if (bVar1) {
    printf("?]");
  }
  else {
    tVar2 = dg::Offset::operator*(in_RDI + 1);
    printf("%lu]",tVar2);
  }
  if (in_RDX != 0) {
    printf("%s",in_RDX);
  }
  return;
}

Assistant:

static void printInterval(T &I, const char *pref = nullptr,
                          const char *suff = nullptr) {
    if (pref)
        printf("%s", pref);

    if (I.start.isUnknown())
        printf("[? - ");
    else
        printf("[%" PRIu64 " - ", *I.start);

    if (I.end.isUnknown())
        printf("?]");
    else
        printf("%" PRIu64 "]", *I.end);

    if (suff)
        printf("%s", suff);
}